

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t archive_entry_acl_next
                  (archive_entry *entry,wchar_t want_type,wchar_t *type,wchar_t *permset,
                  wchar_t *tag,wchar_t *id,char **name)

{
  wchar_t wVar1;
  int *piVar2;
  archive_acl *in_RCX;
  archive *in_RDX;
  undefined8 in_R8;
  wchar_t *in_R9;
  wchar_t *unaff_retaddr;
  wchar_t *in_stack_00000008;
  wchar_t r;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int retvalue;
  
  wVar1 = archive_acl_next(in_RDX,in_RCX,(wchar_t)((ulong)in_R8 >> 0x20),in_R9,
                           (wchar_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_00000008,unaff_retaddr,(char **)in_stack_00000008);
  retvalue = (int)((ulong)in_R9 >> 0x20);
  if (wVar1 == L'\xffffffe2') {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(retvalue,(char *)CONCAT44(wVar1,in_stack_ffffffffffffffc8));
    }
  }
  return wVar1;
}

Assistant:

int
archive_entry_acl_next(struct archive_entry *entry, int want_type, int *type,
    int *permset, int *tag, int *id, const char **name)
{
	int r;
	r = archive_acl_next(entry->archive, &entry->acl, want_type, type,
		permset, tag, id, name);
	if (r == ARCHIVE_FATAL && errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (r);
}